

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FFont::FixXMoves(FFont *this)

{
  ulong uVar1;
  
  if (this->FirstChar <= this->LastChar) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
    } while ((this->LastChar - this->FirstChar) + 1 != uVar1);
  }
  return;
}

Assistant:

void FFont::FixXMoves()
{
	for (int i = 0; i <= LastChar - FirstChar; ++i)
	{
		if (Chars[i].XMove == INT_MIN)
		{
			// Try an uppercase character.
			if (myislower(i + FirstChar))
			{
				int upper = i - 32;
				if (upper >= 0)
				{
					Chars[i].XMove = Chars[upper].XMove;
					continue;
				}
			}
			// Try an unnaccented character.
			int noaccent = stripaccent(i + FirstChar);
			if (noaccent != i + FirstChar)
			{
				noaccent -= FirstChar;
				if (noaccent >= 0)
				{
					Chars[i].XMove = Chars[noaccent].XMove;
					continue;
				}
			}
			Chars[i].XMove = SpaceWidth;
		}
	}
}